

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

xmlElementContentPtr xmlNewDocElementContent(xmlDocPtr doc,xmlChar *name,xmlElementContentType type)

{
  char *pcVar1;
  xmlElementContentPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  _xmlDict *dict;
  int l;
  int local_24;
  
  if (doc == (xmlDocPtr)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = doc->dict;
  }
  if ((type - XML_ELEMENT_CONTENT_SEQ < 2) || (type == XML_ELEMENT_CONTENT_PCDATA)) {
    if (name != (xmlChar *)0x0) {
      pcVar1 = "xmlNewElementContent : name != NULL !\n";
      goto LAB_00192655;
    }
  }
  else {
    if (type != XML_ELEMENT_CONTENT_ELEMENT) {
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s","Internal: ELEMENT content corrupted invalid type\n");
      return (xmlElementContentPtr)0x0;
    }
    if (name == (xmlChar *)0x0) {
      pcVar1 = "xmlNewElementContent : name == NULL !\n";
LAB_00192655:
      __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                      (void *)0x0,0x17,1,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                      (char *)0x0,0,0,"%s",pcVar1);
    }
  }
  pxVar2 = (xmlElementContentPtr)(*xmlMalloc)(0x30);
  if (pxVar2 == (xmlElementContentPtr)0x0) {
    xmlVErrMemory((xmlValidCtxtPtr)0x0,"malloc failed");
    return (xmlElementContentPtr)0x0;
  }
  pxVar2->c2 = (_xmlElementContent *)0x0;
  pxVar2->parent = (_xmlElementContent *)0x0;
  pxVar2->name = (xmlChar *)0x0;
  pxVar2->c1 = (_xmlElementContent *)0x0;
  pxVar2->prefix = (xmlChar *)0x0;
  pxVar2->type = type;
  pxVar2->ocur = XML_ELEMENT_CONTENT_ONCE;
  if (name == (xmlChar *)0x0) {
    return pxVar2;
  }
  pxVar3 = xmlSplitQName3(name,&local_24);
  if (pxVar3 == (xmlChar *)0x0) {
    if (dict == (xmlDictPtr)0x0) goto LAB_001927cc;
  }
  else {
    if (dict == (xmlDictPtr)0x0) {
      pxVar4 = xmlStrndup(name,local_24);
      pxVar2->prefix = pxVar4;
      name = pxVar3;
LAB_001927cc:
      pxVar3 = xmlStrdup(name);
      goto LAB_001927d1;
    }
    pxVar4 = xmlDictLookup(dict,name,local_24);
    pxVar2->prefix = pxVar4;
    name = pxVar3;
  }
  pxVar3 = xmlDictLookup(dict,name,-1);
LAB_001927d1:
  pxVar2->name = pxVar3;
  return pxVar2;
}

Assistant:

xmlElementContentPtr
xmlNewDocElementContent(xmlDocPtr doc, const xmlChar *name,
                        xmlElementContentType type) {
    xmlElementContentPtr ret;
    xmlDictPtr dict = NULL;

    if (doc != NULL)
        dict = doc->dict;

    switch(type) {
	case XML_ELEMENT_CONTENT_ELEMENT:
	    if (name == NULL) {
	        xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"xmlNewElementContent : name == NULL !\n",
			NULL);
	    }
	    break;
        case XML_ELEMENT_CONTENT_PCDATA:
	case XML_ELEMENT_CONTENT_SEQ:
	case XML_ELEMENT_CONTENT_OR:
	    if (name != NULL) {
	        xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
			"xmlNewElementContent : name != NULL !\n",
			NULL);
	    }
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT content corrupted invalid type\n",
		    NULL);
	    return(NULL);
    }
    ret = (xmlElementContentPtr) xmlMalloc(sizeof(xmlElementContent));
    if (ret == NULL) {
	xmlVErrMemory(NULL, "malloc failed");
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlElementContent));
    ret->type = type;
    ret->ocur = XML_ELEMENT_CONTENT_ONCE;
    if (name != NULL) {
        int l;
	const xmlChar *tmp;

	tmp = xmlSplitQName3(name, &l);
	if (tmp == NULL) {
	    if (dict == NULL)
		ret->name = xmlStrdup(name);
	    else
	        ret->name = xmlDictLookup(dict, name, -1);
	} else {
	    if (dict == NULL) {
		ret->prefix = xmlStrndup(name, l);
		ret->name = xmlStrdup(tmp);
	    } else {
	        ret->prefix = xmlDictLookup(dict, name, l);
		ret->name = xmlDictLookup(dict, tmp, -1);
	    }
	}
    }
    return(ret);
}